

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O0

void __thiscall
doctest::anon_unknown_15::JUnitReporter::test_case_reenter(JUnitReporter *this,TestCaseData *in)

{
  char *pcVar1;
  double time;
  allocator<char> local_89;
  string local_88;
  allocator<char> local_61;
  string local_60;
  vector<doctest::String,_std::allocator<doctest::String>_> local_30;
  TestCaseData *local_18;
  TestCaseData *in_local;
  JUnitReporter *this_local;
  
  local_18 = in;
  in_local = (TestCaseData *)this;
  time = detail::Timer::getElapsedSeconds(&this->timer);
  JUnitTestCaseData::addTime(&this->testCaseData,time);
  std::vector<doctest::String,_std::allocator<doctest::String>_>::vector
            (&local_30,&this->deepestSubcaseStackNames);
  JUnitTestCaseData::appendSubcaseNamesToLastTestcase(&this->testCaseData,&local_30);
  std::vector<doctest::String,_std::allocator<doctest::String>_>::~vector(&local_30);
  std::vector<doctest::String,_std::allocator<doctest::String>_>::clear
            (&this->deepestSubcaseStackNames);
  detail::Timer::start(&this->timer);
  pcVar1 = String::c_str(&local_18->m_file);
  pcVar1 = skipPathFromFilename(pcVar1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,pcVar1,&local_61);
  pcVar1 = local_18->m_name;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,pcVar1,&local_89);
  JUnitTestCaseData::add(&this->testCaseData,&local_60,&local_88);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  return;
}

Assistant:

void test_case_reenter(const TestCaseData& in) override {
            testCaseData.addTime(timer.getElapsedSeconds());
            testCaseData.appendSubcaseNamesToLastTestcase(deepestSubcaseStackNames);
            deepestSubcaseStackNames.clear();

            timer.start();
            testCaseData.add(skipPathFromFilename(in.m_file.c_str()), in.m_name);
        }